

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void calc_kurt_all_cols<InputData<float,int>&,WorkerMemory<ImputedData<int,double>,double,float>&,double>
               (InputData<float,_int> *input_data,
               WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
               ModelParams *model_params,double *kurtosis,double *saved_xmin,double *saved_xmax)

{
  bool bVar1;
  size_t *ix_arr;
  float *in_RCX;
  Xoshiro256PP *in_RDX;
  size_t *unaff_RBX;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_RSI;
  size_t in_RDI;
  int *in_R8;
  long in_R9;
  double dVar2;
  int *in_stack_00000010;
  MissingAction in_stack_00000018;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_00000020;
  size_t col;
  double *in_stack_ffffffffffffff18;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  ColumnSampler<double> *in_stack_ffffffffffffff28;
  undefined4 uVar4;
  ColumnSampler<double> *in_stack_ffffffffffffff30;
  double local_c8;
  pointer in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  InputData<float,_int> *in_stack_ffffffffffffff68;
  WorkerMemory<ImputedData<int,_double>,_double,_float> *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff80;
  MissingAction in_stack_ffffffffffffff88;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff90;
  Xoshiro256PP *in_stack_ffffffffffffff98;
  float *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  unsigned_long *in_stack_ffffffffffffffb8;
  
  ColumnSampler<double>::prepare_full_pass(in_stack_ffffffffffffff30);
  do {
    while( true ) {
      bVar1 = ColumnSampler<double>::sample_col
                        (in_stack_ffffffffffffff28,
                         (size_t *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      if (!bVar1) {
        return;
      }
      if (in_R8 != (int *)0x0) break;
LAB_0046fdc2:
      if (*(pointer *)((long)(in_RSI + 0x10) + 8) < *(pointer *)(in_RDI + 8)) {
        if (*(long *)(in_RDI + 0x68) == 0) {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
          if ((bVar1) &&
             (bVar1 = tsl::
                      robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                               *)0x46fe27), bVar1)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x46fe3d);
            dVar2 = calc_kurtosis<float,double>
                              (in_stack_ffffffffffffffb8,
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               (size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                               (MissingAction)((ulong)in_stack_ffffffffffffff98 >> 0x20));
            *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
          }
          else {
            bVar1 = std::vector<double,_std::allocator<double>_>::empty
                              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30)
            ;
            if (bVar1) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x46ff7e);
              dVar2 = calc_kurtosis_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                                (in_stack_ffffffffffffffb8,
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                 (MissingAction)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                 in_stack_ffffffffffffff90);
              *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x46fee4);
              dVar2 = calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,double>
                                (in_stack_ffffffffffffffb8,
                                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                 (size_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                 (MissingAction)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                 (vector<double,_std::allocator<double>_> *)
                                 in_stack_ffffffffffffff90);
              *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
            }
          }
        }
        else {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
          if ((bVar1) &&
             (bVar1 = tsl::
                      robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                      ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                               *)0x47003e), bVar1)) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x470054);
            in_stack_ffffffffffffff18 = *(double **)(in_RDI + 0x68);
            in_stack_ffffffffffffff20 = (undefined4)in_RDX[4].state[1];
            dVar2 = calc_kurtosis<float,int,double>
                              (unaff_RBX,in_RDI,(size_t)in_RSI,(size_t)in_RDX,in_RCX,in_R8,
                               in_stack_00000010,in_stack_00000018);
            *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
          }
          else {
            bVar1 = std::vector<double,_std::allocator<double>_>::empty
                              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30)
            ;
            if (bVar1) {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4701b3);
              in_stack_ffffffffffffff18 = *(double **)(in_RDI + 0x68);
              in_stack_ffffffffffffff20 = (undefined4)in_RDX[4].state[1];
              in_stack_ffffffffffffff28 = (ColumnSampler<double> *)((long)(in_RSI + 1) + 0x30);
              dVar2 = calc_kurtosis_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                                (unaff_RBX,in_RDI,(size_t)in_RSI,(size_t)in_RDX,in_RCX,in_R8,
                                 in_stack_00000010,in_stack_00000018,in_stack_00000020);
              *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
            }
            else {
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x470107);
              in_stack_ffffffffffffff18 = *(double **)(in_RDI + 0x68);
              in_stack_ffffffffffffff20 = (undefined4)in_RDX[4].state[1];
              in_stack_ffffffffffffff28 = (ColumnSampler<double> *)((long)(in_RSI + 2) + 0x30);
              dVar2 = calc_kurtosis_weighted<float,int,std::vector<double,std::allocator<double>>,double>
                                (unaff_RBX,in_RDI,(size_t)in_RSI,(size_t)in_RDX,in_RCX,in_R8,
                                 in_stack_00000010,in_stack_00000018,
                                 (vector<double,_std::allocator<double>_> *)in_stack_00000020);
              *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
            }
          }
        }
      }
      else {
        ix_arr = (size_t *)((long)*(pointer *)((long)(in_RSI + 0x10) + 8) - *(long *)(in_RDI + 8));
        bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
        uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
        uVar4 = (undefined4)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        if ((bVar1) &&
           (bVar1 = tsl::
                    robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)0x4702aa), bVar1)) {
          in_stack_ffffffffffffff90 =
               (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x4702c0);
          in_stack_ffffffffffffff98 = *(Xoshiro256PP **)((long)(in_RSI + 1) + 8);
          in_stack_ffffffffffffffa0 = *(float **)((long)(in_RSI + 1) + 0x10);
          in_stack_ffffffffffffffa8 =
               (int *)(*(long *)(in_RDI + 0x10) + (long)ix_arr * *(long *)(in_RDI + 0x30) * 4);
          in_stack_ffffffffffffffb4 = *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)ix_arr * 4);
          in_stack_ffffffffffffffb8 =
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x47034f);
          in_stack_ffffffffffffff18 =
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x47036b);
          in_stack_ffffffffffffff20 = (undefined4)in_RDX[4].state[1];
          in_stack_ffffffffffffff30 = (ColumnSampler<double> *)&(in_RSI->m_ht).m_nb_elements;
          in_stack_ffffffffffffff28 =
               (ColumnSampler<double> *)CONCAT44(uVar4,(int)in_RDX[4].state[0]);
          dVar2 = calc_kurtosis<double>
                            ((size_t *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                             in_stack_ffffffffffffff58,
                             (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                             (size_t *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                             in_stack_ffffffffffffff88,(CategSplit)in_stack_ffffffffffffff90,
                             in_stack_ffffffffffffff98);
          *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
        }
        else {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
          if (bVar1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x470542);
            in_stack_ffffffffffffff48 = *(pointer *)((long)(in_RSI + 1) + 8);
            in_stack_ffffffffffffff50 = *(undefined8 *)((long)(in_RSI + 1) + 0x10);
            in_stack_ffffffffffffff58 =
                 (int *)(*(long *)(in_RDI + 0x10) + (long)ix_arr * *(long *)(in_RDI + 0x30) * 4);
            in_stack_ffffffffffffff64 = *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)ix_arr * 4)
            ;
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4705c5);
            in_stack_ffffffffffffff20 = (undefined4)in_RDX[4].state[0];
            in_stack_ffffffffffffff28 = (ColumnSampler<double> *)&(in_RSI->m_ht).m_nb_elements;
            in_stack_ffffffffffffff30 = (ColumnSampler<double> *)&in_RSI[1].m_ht.m_nb_elements;
            in_stack_ffffffffffffff18 = (double *)CONCAT44(uVar3,(int)in_RDX[4].state[1]);
            dVar2 = calc_kurtosis_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                              (ix_arr,(size_t)in_stack_ffffffffffffffb8,
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8,
                               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                               (double *)in_stack_ffffffffffffff98,(MissingAction)in_R8,
                               (CategSplit)in_RCX,in_RDX,in_RSI);
            *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
          }
          else {
            in_stack_ffffffffffffff68 =
                 (InputData<float,_int> *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x470427);
            in_stack_ffffffffffffff70 =
                 *(WorkerMemory<ImputedData<int,_double>,_double,_float> **)((long)(in_RSI + 1) + 8)
            ;
            in_stack_ffffffffffffff80 =
                 (double *)(*(long *)(in_RDI + 0x10) + (long)ix_arr * *(long *)(in_RDI + 0x30) * 4);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4704aa);
            in_stack_ffffffffffffff20 = (undefined4)in_RDX[4].state[0];
            in_stack_ffffffffffffff28 = (ColumnSampler<double> *)&(in_RSI->m_ht).m_nb_elements;
            in_stack_ffffffffffffff30 = (ColumnSampler<double> *)((long)(in_RSI + 2) + 0x30);
            in_stack_ffffffffffffff18 = (double *)CONCAT44(uVar3,(int)in_RDX[4].state[1]);
            dVar2 = calc_kurtosis_weighted<std::vector<double,std::allocator<double>>,double>
                              (ix_arr,(size_t)in_stack_ffffffffffffffb8,
                               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8,
                               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                               (double *)in_stack_ffffffffffffff98,(MissingAction)in_R8,
                               (CategSplit)in_RCX,in_RDX,
                               (vector<double,_std::allocator<double>_> *)in_RSI);
            *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
          }
        }
      }
      if ((*(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) == -INFINITY) &&
         (!NAN(*(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2)))) {
        ColumnSampler<double>::drop_col
                  ((ColumnSampler<double> *)
                   CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                   (size_t)in_stack_ffffffffffffff18);
      }
      if ((*(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) != -INFINITY) ||
         (NAN(*(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2)))) {
        local_c8 = *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) + -1.0;
        if (local_c8 <= 1e-08) {
          local_c8 = 1e-08;
        }
      }
      else {
        local_c8 = 0.0;
      }
      *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = local_c8;
      if ((*(long *)(in_RDI + 0x50) != 0) &&
         (0.0 < *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2))) {
        *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) =
             (double)*(float *)(*(long *)(in_RDI + 0x50) +
                               (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 4) *
             *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2);
        dVar2 = *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2);
        if (dVar2 <= 1e-100) {
          dVar2 = 1e-100;
        }
        *(double *)(in_RCX + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) = dVar2;
      }
    }
    get_split_range<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
               (ModelParams *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    if (((ulong)in_RSI[3].m_ht.m_buckets_data.
                super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
      if (in_R8 != (int *)0x0) {
        *(pointer *)(in_R8 + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 2) =
             (((_Vector_impl *)&in_RSI[3].m_ht.super_power_of_two_growth_policy<2UL>)->
             super__Vector_impl_data)._M_start;
        *(pointer *)(in_R9 + (long)*(pointer *)((long)(in_RSI + 0x10) + 8) * 8) =
             in_RSI[3].m_ht.m_buckets_data.
             super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      goto LAB_0046fdc2;
    }
    ColumnSampler<double>::drop_col
              ((ColumnSampler<double> *)
               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (size_t)in_stack_ffffffffffffff18);
  } while( true );
}

Assistant:

void calc_kurt_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                        double *restrict kurtosis, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (saved_xmin != NULL)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }

        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                               model_params.missing_action, workspace.weights_map);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                      typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                      ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      workspace.col_chosen,
                                      input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                      model_params.missing_action);
                }

                else if (!workspace.weights_arr.empty())
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_arr), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_arr);
                }

                else
                {
                    kurtosis[workspace.col_chosen] =
                        calc_kurtosis_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                               typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                               decltype(workspace.weights_map), ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               workspace.col_chosen,
                                               input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                               model_params.missing_action, workspace.weights_map);
                }
            }
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis<ldouble_safe>(
                                  workspace.ix_arr.data(), workspace.st, workspace.end,
                                  input_data.categ_data + col * input_data.nrows,
                                  input_data.ncat[col],
                                  workspace.buffer_szt.data(), workspace.buffer_dbl.data(),
                                  model_params.missing_action, model_params.cat_split_type,
                                  workspace.rnd_generator);
            }

            else if (!workspace.weights_arr.empty())
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_arr), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_arr);
            }

            else
            {
                kurtosis[workspace.col_chosen] =
                    calc_kurtosis_weighted<decltype(workspace.weights_map), ldouble_safe>(
                                           workspace.ix_arr.data(), workspace.st, workspace.end,
                                           input_data.categ_data + col * input_data.nrows,
                                           input_data.ncat[col],
                                           workspace.buffer_dbl.data(),
                                           model_params.missing_action, model_params.cat_split_type,
                                           workspace.rnd_generator, workspace.weights_map);
            }
        }

        if (kurtosis[workspace.col_chosen] == -HUGE_VAL)
            workspace.col_sampler.drop_col(workspace.col_chosen);

        kurtosis[workspace.col_chosen] = (kurtosis[workspace.col_chosen] == -HUGE_VAL)?
                                            0. : std::fmax(1e-8, -1. + kurtosis[workspace.col_chosen]);
        if (input_data.col_weights != NULL && kurtosis[workspace.col_chosen] > 0)
        {
            kurtosis[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            kurtosis[workspace.col_chosen] = std::fmax(kurtosis[workspace.col_chosen], 1e-100);
        }
    }
}